

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_merge.cpp
# Opt level: O0

int __thiscall BamTools::MergeTool::Run(MergeTool *this,int argc,char **argv)

{
  bool bVar1;
  MergeToolPrivate *this_00;
  long in_RDI;
  int in_stack_000003c4;
  char **in_stack_000003c8;
  int in_stack_000003d4;
  MergeToolPrivate *in_stack_00000718;
  uint local_4;
  
  Options::Parse(in_stack_000003d4,in_stack_000003c8,in_stack_000003c4);
  this_00 = (MergeToolPrivate *)operator_new(8);
  MergeToolPrivate::MergeToolPrivate(this_00,*(MergeSettings **)(in_RDI + 8));
  *(MergeToolPrivate **)(in_RDI + 0x10) = this_00;
  bVar1 = MergeToolPrivate::Run(in_stack_00000718);
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

int MergeTool::Run(int argc, char* argv[])
{

    // parse command line arguments
    Options::Parse(argc, argv, 1);

    // initialize MergeTool with settings
    m_impl = new MergeToolPrivate(m_settings);

    // run MergeTool, return success/fail
    if (m_impl->Run())
        return 0;
    else
        return 1;
}